

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void lest::shuffle(tests *specification,options option)

{
  rng local_9;
  
  srand(option.seed);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,lest::rng>
            ((specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (specification->super__Vector_base<lest::test,_std::allocator<lest::test>_>)._M_impl.
             super__Vector_impl_data._M_finish,&local_9);
  return;
}

Assistant:

inline void shuffle( tests & specification, options option )
{
#if lest_CPP11_OR_GREATER
    std::shuffle( specification.begin(), specification.end(), std::mt19937( option.seed ) );
#else
    lest::srand( option.seed );

    rng generator;
    std::random_shuffle( specification.begin(), specification.end(), generator );
#endif
}